

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::updateSurpluses<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,MultiIndexSet *work,int max_level,
          vector<int,_std::allocator<int>_> *level,Data2D<int> *dagUp)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  size_t sVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  int j;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar16;
  bool local_102;
  allocator_type local_101;
  size_type local_100;
  MultiIndexSet *local_f8;
  ulong local_f0;
  size_type local_e8;
  ulong local_e0;
  ulong local_d8;
  Data2D<int> *local_d0;
  long local_c8;
  ulong local_c0;
  vector<bool,_std::allocator<bool>_> used;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  indexses_for_levels;
  vector<double,_std::allocator<double>_> x;
  
  local_100 = (size_type)work->cache_num_indexes;
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_f8 = work;
  local_d0 = dagUp;
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&indexses_for_levels,(long)max_level + 1,(allocator_type *)&used);
  for (used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p._0_4_ = 0;
      (int)used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p < (int)local_100;
      used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           (int)used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p + 1) {
    lVar9 = (long)(level->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start
                  [(int)used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p];
    if (0 < lVar9) {
      ::std::vector<int,_std::allocator<int>_>::push_back
                (indexses_for_levels.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar9,(value_type_conflict3 *)&used);
    }
  }
  local_e8 = (size_type)(max_level + 1);
  if (max_level < 1) {
    max_level = 0;
  }
  local_e0 = (ulong)(max_level + 1);
  uVar12 = 1;
  do {
    if (uVar12 == local_e0) {
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&indexses_for_levels);
      return;
    }
    local_c8 = uVar12 * 0x18;
    piVar3 = indexses_for_levels.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    piVar4 = indexses_for_levels.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_d8 = uVar12;
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&x,
               (long)(this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&used);
    sVar11 = local_e8;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&monkey_count,local_e8,(allocator_type *)&used);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&monkey_tail,sVar11,(allocator_type *)&used);
    local_102 = false;
    ::std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&used,local_100,&local_102,&local_101);
    uVar12 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
    local_c0 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      local_c0 = 0;
    }
    uVar12 = 0;
LAB_001a0464:
    if (uVar12 != local_c0) {
      iVar2 = *(int *)(*(long *)((long)&((indexses_for_levels.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data._M_start + local_c8) + uVar12 * 4);
      sVar5 = local_f8->num_dimensions;
      piVar3 = (local_f8->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar9 = 0; lVar9 < (this->super_BaseCanonicalGrid).num_dimensions; lVar9 = lVar9 + 1) {
        dVar15 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)3>
                           (piVar3[sVar5 * (long)iVar2 + lVar9]);
        x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] = dVar15;
      }
      __first.super__Bit_iterator_base._M_p._4_4_ =
           used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p._4_4_;
      __first.super__Bit_iterator_base._M_p._0_4_ =
           (int)used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      local_102 = false;
      __first.super__Bit_iterator_base._8_8_ = 0;
      __last.super__Bit_iterator_base._12_4_ = 0;
      __last.super__Bit_iterator_base._M_p =
           used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
      __last.super__Bit_iterator_base._M_offset =
           used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      std::__fill_a1(__first,__last,&local_102);
      lVar9 = (this->surpluses).stride * (long)iVar2;
      pdVar6 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = 0;
      *monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = iVar2;
      uVar14 = 0;
      piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar14 = (ulong)(int)uVar14;
        while( true ) {
          if (iVar1 <= *piVar8) {
            uVar12 = uVar12 + 1;
            goto LAB_001a0464;
          }
          if (piVar8[uVar14] < iVar1) break;
          uVar14 = uVar14 - 1;
          piVar8[(int)uVar14] = piVar8[(int)uVar14] + 1;
        }
        iVar2 = (local_d0->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14] * local_d0->stride +
                 (long)piVar8[uVar14]];
        sVar11 = (size_type)iVar2;
        local_f0 = uVar12;
        if ((sVar11 == 0xffffffffffffffff) ||
           (rVar16 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&used,sVar11),
           piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start, (*rVar16._M_p & rVar16._M_mask) != 0)) {
          piVar8[uVar14] = piVar8[uVar14] + 1;
          uVar12 = local_f0;
        }
        else {
          sVar5 = (this->surpluses).stride;
          pdVar7 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          dVar15 = evalBasisRaw<(TasGrid::RuleLocal::erule)3>
                             (this,(local_f8->indexes).super__Vector_base<int,_std::allocator<int>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                   local_f8->num_dimensions * sVar11,
                              x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
          uVar13 = (this->super_BaseCanonicalGrid).num_outputs;
          uVar12 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar12 = 0;
          }
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            pdVar6[lVar9 + uVar10] =
                 pdVar7[sVar5 * sVar11 + uVar10] * -dVar15 + pdVar6[lVar9 + uVar10];
          }
          rVar16 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&used,sVar11);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          uVar13 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar13;
          monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)uVar13] = 0;
          monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)uVar13] = iVar2;
          piVar8 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = local_f0;
        }
      } while( true );
    }
    ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&used);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&x);
    uVar12 = local_d8 + 1;
  } while( true );
}

Assistant:

void GridLocalPolynomial::updateSurpluses(MultiIndexSet const &work, int max_level, std::vector<int> const &level, Data2D<int> const &dagUp){
    int num_points = work.getNumIndexes();
    int max_parents = num_dimensions * RuleLocal::getMaxNumParents<effrule>();

    std::vector<std::vector<int>> indexses_for_levels((size_t) max_level+1);
    for(int i=0; i<num_points; i++)
        if (level[i] > 0) indexses_for_levels[level[i]].push_back(i);

    for(int l=1; l<=max_level; l++){
        int level_size = (int) indexses_for_levels[l].size();
        #pragma omp parallel
        {
            std::vector<double> x(num_dimensions);

            std::vector<int> monkey_count(max_level + 1);
            std::vector<int> monkey_tail(max_level + 1);
            std::vector<bool> used(num_points, false);

            #pragma omp for schedule(dynamic)
            for(int s=0; s<level_size; s++){
                int i = indexses_for_levels[l][s];

                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    x[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                double *surpi = surpluses.getStrip(i);

                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || (used[branch])){
                            monkey_count[current]++;
                        }else{
                            const double *branch_surp = surpluses.getStrip(branch);
                            double basis_value = evalBasisRaw<effrule>(work.getIndex(branch), x.data());
                            for(int k=0; k<num_outputs; k++)
                                surpi[k] -= basis_value * branch_surp[k];
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            } // for-loop
        } // omp parallel
    } // level loop
}